

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::SubroutineSymbol::connectExternInterfacePrototype(SubroutineSymbol *this)

{
  string_view *sv;
  SymbolKind SVar1;
  Scope *this_00;
  MethodPrototypeSymbol *pMVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  InstanceSymbol *this_01;
  Symbol *pSVar6;
  Diagnostic *pDVar7;
  Diagnostic *this_02;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this_03;
  uint64_t uVar8;
  SourceLocation location;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  DiagCode code;
  DiagCode code_00;
  ulong uVar12;
  basic_string_view<char,_std::char_traits<char>_> *__y;
  bool bVar13;
  undefined1 auVar14 [16];
  char cVar15;
  char cVar16;
  char cVar17;
  byte bVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  byte bVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  byte bVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  byte bVar30;
  string_view arg;
  string_view name;
  IfaceConn IVar31;
  SourceRange SVar32;
  Token nameToken;
  ModportSymbol *local_90;
  Token local_80;
  long local_70;
  ulong local_68;
  ulong local_60;
  char local_58;
  char cStack_57;
  char cStack_56;
  byte bStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  byte bStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  byte bStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  byte bStack_49;
  char local_48;
  char cStack_47;
  char cStack_46;
  byte bStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  byte bStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  byte bStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  byte bStack_39;
  
  if (this->prototype != (MethodPrototypeSymbol *)0x0) {
    return;
  }
  this_00 = (this->super_Symbol).parentScope;
  local_80 = slang::syntax::SyntaxNode::getFirstToken
                       (*(SyntaxNode **)((this->super_Symbol).originatingSyntax[3].parent + 5));
  name = parsing::Token::valueText(&local_80);
  this_01 = (InstanceSymbol *)Scope::find(this_00,name);
  if (this_01 == (InstanceSymbol *)0x0) {
    if (name._M_len == 0) {
      return;
    }
    SVar32 = parsing::Token::range(&local_80);
    code.subsystem = Lookup;
    code.code = 0x34;
LAB_0069f927:
    pDVar7 = Scope::addDiag(this_00,code,SVar32);
  }
  else {
    SVar1 = (this_01->super_InstanceSymbolBase).super_Symbol.kind;
    if (SVar1 == UninstantiatedDef) {
      return;
    }
    if (SVar1 == Instance) {
      bVar13 = InstanceSymbol::isInterface(this_01);
      if (!bVar13) {
LAB_0069f912:
        SVar32 = parsing::Token::range(&local_80);
        code.subsystem = Lookup;
        code.code = 0x27;
        goto LAB_0069f927;
      }
      IVar31.second = (ModportSymbol *)0x0;
      IVar31.first = (Symbol *)this_01;
    }
    else {
      if (SVar1 == InstanceArray) {
LAB_0069f8c0:
        SVar32 = parsing::Token::range(&local_80);
        Scope::addDiag(this_00,(DiagCode)0x3b0006,SVar32);
        return;
      }
      if (SVar1 != InterfacePort) goto LAB_0069f912;
      IVar31 = InterfacePortSymbol::getConnection((InterfacePortSymbol *)this_01);
      if (IVar31.first == (Symbol *)0x0) {
        return;
      }
      if ((IVar31.first)->kind == InstanceArray) goto LAB_0069f8c0;
    }
    local_90 = IVar31.second;
    sv = &(this->super_Symbol).name;
    pSVar6 = Scope::find((Scope *)(IVar31.first[1].name._M_str + 0x40),(this->super_Symbol).name);
    if (pSVar6 != (Symbol *)0x0) {
      if (pSVar6->kind == Subroutine) {
        if ((pSVar6[3].field_0x4 & 0x10) != 0) {
          pMVar2 = (MethodPrototypeSymbol *)pSVar6[4].name._M_str;
          if ((((pMVar2->flags).m_bits & 0x800) == 0) &&
             (pMVar2->firstExternImpl != (ExternImpl *)0x0)) {
            pDVar7 = Scope::addDiag(this_00,(DiagCode)0x300006,(this->super_Symbol).location);
            bVar13 = this->subroutineKind == Function;
            pcVar9 = "task";
            if (bVar13) {
              pcVar9 = "function";
            }
            arg._M_str = pcVar9;
            arg._M_len = (ulong)bVar13 * 4 + 4;
            Diagnostic::operator<<(pDVar7,arg);
            this_02 = Diagnostic::operator<<(pDVar7,name);
            Diagnostic::operator<<(this_02,(this->super_Symbol).name);
            Diagnostic::addNote(pDVar7,(DiagCode)0xa0001,
                                (((pMVar2->firstExternImpl->impl).ptr)->super_Symbol).location);
          }
          MethodPrototypeSymbol::addExternImpl(pMVar2,this);
          MethodPrototypeSymbol::checkMethodMatch(pMVar2,this_00,this);
          this->prototype = pMVar2;
          if (local_90 == (ModportSymbol *)0x0) {
            return;
          }
          if (local_90->hasExports != true) {
            return;
          }
          this_03 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                    Scope::getNameMap(&local_90->super_Scope);
          uVar8 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                            (this_03,sv);
          uVar10 = uVar8 >> ((byte)*this_03 & 0x3f);
          lVar11 = (uVar8 & 0xff) * 4;
          cVar15 = (&UNK_007e24cc)[lVar11];
          cVar16 = (&UNK_007e24cd)[lVar11];
          cVar17 = (&UNK_007e24ce)[lVar11];
          bVar18 = (&UNK_007e24cf)[lVar11];
          uVar12 = 0;
          cVar19 = cVar15;
          cVar20 = cVar16;
          cVar21 = cVar17;
          bVar22 = bVar18;
          cVar23 = cVar15;
          cVar24 = cVar16;
          cVar25 = cVar17;
          bVar26 = bVar18;
          cVar27 = cVar15;
          cVar28 = cVar16;
          cVar29 = cVar17;
          bVar30 = bVar18;
          do {
            pcVar9 = (char *)(*(long *)(this_03 + 0x10) + uVar10 * 0x10);
            local_48 = *pcVar9;
            cStack_47 = pcVar9[1];
            cStack_46 = pcVar9[2];
            bStack_45 = pcVar9[3];
            cStack_44 = pcVar9[4];
            cStack_43 = pcVar9[5];
            cStack_42 = pcVar9[6];
            bStack_41 = pcVar9[7];
            cStack_40 = pcVar9[8];
            cStack_3f = pcVar9[9];
            cStack_3e = pcVar9[10];
            bStack_3d = pcVar9[0xb];
            cStack_3c = pcVar9[0xc];
            cStack_3b = pcVar9[0xd];
            cStack_3a = pcVar9[0xe];
            bVar4 = pcVar9[0xf];
            auVar14[0] = -(local_48 == cVar15);
            auVar14[1] = -(cStack_47 == cVar16);
            auVar14[2] = -(cStack_46 == cVar17);
            auVar14[3] = -(bStack_45 == bVar18);
            auVar14[4] = -(cStack_44 == cVar19);
            auVar14[5] = -(cStack_43 == cVar20);
            auVar14[6] = -(cStack_42 == cVar21);
            auVar14[7] = -(bStack_41 == bVar22);
            auVar14[8] = -(cStack_40 == cVar23);
            auVar14[9] = -(cStack_3f == cVar24);
            auVar14[10] = -(cStack_3e == cVar25);
            auVar14[0xb] = -(bStack_3d == bVar26);
            auVar14[0xc] = -(cStack_3c == cVar27);
            auVar14[0xd] = -(cStack_3b == cVar28);
            auVar14[0xe] = -(cStack_3a == cVar29);
            auVar14[0xf] = -(bVar4 == bVar30);
            uVar5 = (uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe);
            bStack_39 = bVar4;
            if (uVar5 != 0) {
              local_70 = *(long *)(this_03 + 0x10) + uVar10 * 0x10;
              lVar11 = *(long *)(this_03 + 0x18);
              local_68 = uVar12;
              local_60 = uVar10;
              local_58 = cVar15;
              cStack_57 = cVar16;
              cStack_56 = cVar17;
              bStack_55 = bVar18;
              cStack_54 = cVar19;
              cStack_53 = cVar20;
              cStack_52 = cVar21;
              bStack_51 = bVar22;
              cStack_50 = cVar23;
              cStack_4f = cVar24;
              cStack_4e = cVar25;
              bStack_4d = bVar26;
              cStack_4c = cVar27;
              cStack_4b = cVar28;
              cStack_4a = cVar29;
              bStack_49 = bVar30;
              do {
                uVar3 = 0;
                if (uVar5 != 0) {
                  for (; (uVar5 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
                  }
                }
                __y = (basic_string_view<char,_std::char_traits<char>_> *)
                      ((ulong)uVar3 * 0x18 + lVar11 + uVar10 * 0x168);
                bVar13 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                         operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                     *)this_03,sv,__y);
                if (bVar13) goto LAB_0069fbe7;
                uVar5 = uVar5 - 1 & uVar5;
              } while (uVar5 != 0);
              bVar4 = *(byte *)(local_70 + 0xf);
              uVar10 = local_60;
              uVar12 = local_68;
              cVar15 = local_58;
              cVar16 = cStack_57;
              cVar17 = cStack_56;
              bVar18 = bStack_55;
              cVar19 = cStack_54;
              cVar20 = cStack_53;
              cVar21 = cStack_52;
              bVar22 = bStack_51;
              cVar23 = cStack_50;
              cVar24 = cStack_4f;
              cVar25 = cStack_4e;
              bVar26 = bStack_4d;
              cVar27 = cStack_4c;
              cVar28 = cStack_4b;
              cVar29 = cStack_4a;
              bVar30 = bStack_49;
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar8 & 7] & bVar4) == 0) break;
            lVar11 = uVar10 + uVar12;
            uVar12 = uVar12 + 1;
            uVar10 = lVar11 + 1U & *(ulong *)(this_03 + 8);
          } while (uVar12 <= *(ulong *)(this_03 + 8));
          __y = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
LAB_0069fbe7:
          Scope::getNameMap(&local_90->super_Scope);
          if (__y == (basic_string_view<char,_std::char_traits<char>_> *)0x0) {
            return;
          }
          pMVar2 = (MethodPrototypeSymbol *)__y[1]._M_len;
          if (pMVar2 == (MethodPrototypeSymbol *)0x0) {
            return;
          }
          if ((pMVar2->super_Symbol).kind != MethodPrototype) {
            return;
          }
          if (((pMVar2->flags).m_bits & 0x40) == 0) {
            return;
          }
          MethodPrototypeSymbol::addExternImpl(pMVar2,this);
          return;
        }
        location = (this->super_Symbol).location;
        code_00.subsystem = Declarations;
        code_00.code = 0x42;
      }
      else {
        location = (this->super_Symbol).location;
        code_00.subsystem = Lookup;
        code_00.code = 0x23;
      }
      pDVar7 = Scope::addDiag(this_00,code_00,location);
      Diagnostic::operator<<(pDVar7,(this->super_Symbol).name);
      Diagnostic::addNote(pDVar7,(DiagCode)0x50001,pSVar6->location);
      return;
    }
    if (sv->_M_len == 0) {
      return;
    }
    pDVar7 = Scope::addDiag(this_00,(DiagCode)0x3a000a,(this->super_Symbol).location);
    pDVar7 = Diagnostic::operator<<(pDVar7,(this->super_Symbol).name);
  }
  Diagnostic::operator<<(pDVar7,name);
  return;
}

Assistant:

void SubroutineSymbol::connectExternInterfacePrototype() const {
    if (prototype)
        return;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    SLANG_ASSERT(scope && syntax);

    auto nameToken = syntax->as<FunctionDeclarationSyntax>().prototype->name->getFirstToken();
    auto ifaceName = nameToken.valueText();
    auto symbol = scope->find(ifaceName);
    if (!symbol) {
        if (!ifaceName.empty())
            scope->addDiag(diag::UndeclaredIdentifier, nameToken.range()) << ifaceName;
        return;
    }

    const InstanceSymbol* inst = nullptr;
    const ModportSymbol* modport = nullptr;
    if (symbol->kind == SymbolKind::InterfacePort) {
        const Symbol* conn;
        auto& port = symbol->as<InterfacePortSymbol>();
        std::tie(conn, modport) = port.getConnection();
        if (!conn)
            return;

        if (conn->kind == SymbolKind::InstanceArray) {
            scope->addDiag(diag::ExternIfaceArrayMethod, nameToken.range());
            return;
        }

        inst = &conn->as<InstanceSymbol>();
    }
    else if (symbol->kind == SymbolKind::Instance) {
        inst = &symbol->as<InstanceSymbol>();
        if (!inst->isInterface()) {
            scope->addDiag(diag::NotAnInterfaceOrPort, nameToken.range()) << ifaceName;
            return;
        }
    }
    else if (symbol->kind == SymbolKind::InstanceArray) {
        scope->addDiag(diag::ExternIfaceArrayMethod, nameToken.range());
        return;
    }
    else {
        if (symbol->kind != SymbolKind::UninstantiatedDef)
            scope->addDiag(diag::NotAnInterfaceOrPort, nameToken.range()) << ifaceName;
        return;
    }

    auto ifaceMethod = inst->body.find(name);
    if (!ifaceMethod) {
        if (!name.empty())
            scope->addDiag(diag::UnknownMember, location) << name << ifaceName;
        return;
    }

    if (ifaceMethod->kind != SymbolKind::Subroutine) {
        auto& diag = scope->addDiag(diag::NotASubroutine, location);
        diag << name;
        diag.addNote(diag::NoteDeclarationHere, ifaceMethod->location);
        return;
    }

    auto& sub = ifaceMethod->as<SubroutineSymbol>();
    if (!sub.flags.has(MethodFlags::InterfaceExtern)) {
        auto& diag = scope->addDiag(diag::IfaceMethodNotExtern, location);
        diag << name;
        diag.addNote(diag::NoteDeclarationHere, ifaceMethod->location);
        return;
    }

    auto proto = sub.getPrototype();
    SLANG_ASSERT(proto);

    if (!proto->flags.has(MethodFlags::ForkJoin) && proto->getFirstExternImpl() != nullptr) {
        auto& diag = scope->addDiag(diag::DupInterfaceExternMethod, location);
        diag << (subroutineKind == SubroutineKind::Function ? "function"sv : "task"sv);
        diag << ifaceName << name;
        diag.addNote(diag::NotePreviousDefinition, proto->getFirstExternImpl()->impl->location);
    }

    proto->addExternImpl(*this);
    proto->checkMethodMatch(*scope, *this);
    prototype = proto;

    // If our connection goes through a modport that exports us we should register ourselves
    // as an implementation for that export to facilitate checking for missing exports later.
    if (modport && modport->hasExports) {
        if (auto it = modport->getNameMap().find(name); it != modport->getNameMap().end()) {
            if (it->second && it->second->kind == SymbolKind::MethodPrototype) {
                auto& modportProto = it->second->as<MethodPrototypeSymbol>();
                if (modportProto.flags.has(MethodFlags::ModportExport))
                    modportProto.addExternImpl(*this);
            }
        }
    }
}